

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.cpp
# Opt level: O0

void __thiscall
cfd::api::json::DecodeRawTransactionTxIn::ConvertFromStruct
          (DecodeRawTransactionTxIn *this,DecodeRawTransactionTxInStruct *data)

{
  undefined3 uVar1;
  DecodeUnlockingScript *in_RSI;
  DecodeUnlockingScriptStruct *in_RDI;
  
  std::__cxx11::string::operator=((string *)&in_RDI->field_0x38,(string *)in_RSI);
  std::__cxx11::string::operator=
            ((string *)&(in_RDI->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
             (string *)&(in_RSI->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left)
  ;
  *(undefined4 *)&in_RDI[1].field_0x8 = *(undefined4 *)&in_RSI->field_0x40;
  DecodeUnlockingScript::ConvertFromStruct(in_RSI,in_RDI);
  core::
  JsonValueVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::ConvertFromStruct((JsonValueVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)data);
  uVar1 = *(undefined3 *)&in_RSI[1].field_0x59;
  in_RDI[2].field_0x38 = in_RSI[1].hex_;
  *(undefined3 *)&in_RDI[2].field_0x39 = uVar1;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_RSI,
              (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_RDI);
  return;
}

Assistant:

void DecodeRawTransactionTxIn::ConvertFromStruct(
    const DecodeRawTransactionTxInStruct& data) {
  coinbase_ = data.coinbase;
  txid_ = data.txid;
  vout_ = data.vout;
  script_sig_.ConvertFromStruct(data.script_sig);
  txinwitness_.ConvertFromStruct(data.txinwitness);
  sequence_ = data.sequence;
  ignore_items = data.ignore_items;
}